

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O2

int readOpcodeRegister(InternalInstruction *insn,uint8_t size)

{
  Reg RVar1;
  Reg RVar3;
  undefined3 in_register_00000031;
  uint uVar4;
  ulong uVar2;
  
  uVar4 = CONCAT31(in_register_00000031,size);
  if (uVar4 == 0) {
    uVar4 = (uint)insn->registerSize;
  }
  insn->operandSize = (uint8_t)uVar4;
  RVar1 = (uVar4 & 0xff) - MODRM_REG_CL;
  uVar2 = (ulong)RVar1;
  if (RVar1 < MODRM_REG_R8B) {
    RVar1 = (&switchD_0021e452::switchdataD_003cd3e8)[uVar2] + 0x3cd3e8;
    switch(uVar2) {
    case 0:
      RVar3 = *(int *)&insn->rexPrefix * 8 & MODRM_REG_R8B;
      RVar1 = insn->opcode & MODRM_REG_BH | RVar3;
      insn->opcodeRegister = RVar1;
      if (RVar3 != MODRM_REG_AL) {
        return RVar1;
      }
      if ((char)*(int *)&insn->rexPrefix == '\0') {
        return RVar1;
      }
      if ((byte)RVar1 < 4) {
        return RVar1;
      }
      RVar1 = RVar1 + MODRM_REG_R12B;
      break;
    case 1:
      RVar1 = (insn->opcode & 7) + (*(uint *)&insn->rexPrefix & 1) * 8 + MODRM_REG_AX;
      break;
    default:
      goto switchD_0021e452_caseD_2;
    case 3:
      RVar1 = (insn->opcode & 7) + (*(uint *)&insn->rexPrefix & 1) * 8 + MODRM_REG_EAX;
      break;
    case 7:
      RVar1 = (insn->opcode & 7) + (*(uint *)&insn->rexPrefix & 1) * 8 + MODRM_REG_RAX;
    }
    insn->opcodeRegister = RVar1;
  }
switchD_0021e452_caseD_2:
  return RVar1;
}

Assistant:

static int readOpcodeRegister(struct InternalInstruction *insn, uint8_t size)
{
	// dbgprintf(insn, "readOpcodeRegister()");

	if (size == 0)
		size = insn->registerSize;

	insn->operandSize = size;

	switch (size) {
		case 1:
			insn->opcodeRegister = (Reg)(MODRM_REG_AL + ((bFromREX(insn->rexPrefix) << 3)
						| (insn->opcode & 7)));
			if (insn->rexPrefix &&
					insn->opcodeRegister >= MODRM_REG_AL + 0x4 &&
					insn->opcodeRegister < MODRM_REG_AL + 0x8) {
				insn->opcodeRegister = (Reg)(MODRM_REG_SPL
						+ (insn->opcodeRegister - MODRM_REG_AL - 4));
			}

			break;
		case 2:
			insn->opcodeRegister = (Reg)(MODRM_REG_AX
					+ ((bFromREX(insn->rexPrefix) << 3)
						| (insn->opcode & 7)));
			break;
		case 4:
			insn->opcodeRegister = (Reg)(MODRM_REG_EAX
					+ ((bFromREX(insn->rexPrefix) << 3)
						| (insn->opcode & 7)));
			break;
		case 8:
			insn->opcodeRegister = (Reg)(MODRM_REG_RAX
					+ ((bFromREX(insn->rexPrefix) << 3)
						| (insn->opcode & 7)));
			break;
	}

	return 0;
}